

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrCMP0xc5(CPU *this)

{
  uint8_t reg;
  uint8_t argument;
  
  reg = this->A;
  argument = zeropage_addr(this);
  CMP(this,reg,argument);
  return 3;
}

Assistant:

int CPU::instrCMP0xc5() {
	CMP(A, zeropage_addr());
	return 3;
}